

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_string_split(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int *piVar1;
  JSShape *sh;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  JSValueUnion JVar6;
  uint uVar7;
  JSValueUnion JVar8;
  int64_t iVar9;
  ulong uVar10;
  ulong unaff_RBX;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong unaff_R15;
  JSValue JVar15;
  JSValue JVar16;
  JSValue JVar17;
  JSValue JVar18;
  JSValue JVar19;
  JSValue JVar20;
  uint32_t lim;
  ulong local_c0;
  uint local_9c;
  JSValueUnion local_98;
  JSValueUnion local_90;
  int local_84;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  long local_68;
  JSValueUnion local_60;
  JSValueUnion local_58;
  int64_t local_50;
  int *local_48;
  int64_t local_40;
  
  if (((uint)this_val.tag & 0xfffffffe) == 2) {
    JS_ThrowTypeError(ctx,"cannot convert to object");
    JVar18 = (JSValue)(ZEXT816(6) << 0x40);
    uVar14 = 0;
    goto LAB_0016b353;
  }
  JVar19 = *argv;
  JVar18 = *argv;
  piVar1 = (int *)argv[1].u.ptr;
  iVar9 = argv[1].tag;
  JVar15 = argv[1];
  local_90.float64 = local_90.float64 & 0xffffffff00000000;
  local_98.float64 = local_98.float64 & 0xffffffff00000000;
  uVar12 = (uint)argv->tag;
  if ((uVar12 & 0xfffffffe) != 2) {
    JVar16 = JS_GetPropertyInternal(ctx,*argv,0xcb,*argv,0);
    iVar5 = (int)JVar16.tag;
    if ((iVar5 == 2) || (iVar5 == 3)) {
      bVar4 = true;
LAB_0016af8f:
      auVar3._8_8_ = 0;
      auVar3._0_8_ = unaff_R15;
      JVar18 = (JSValue)(auVar3 << 0x40);
    }
    else {
      if (iVar5 == 6) {
        unaff_R15 = 6;
        bVar4 = false;
        goto LAB_0016af8f;
      }
      local_58 = this_val.u;
      local_50 = this_val.tag;
      local_48 = piVar1;
      local_40 = iVar9;
      JVar18 = JS_CallFree(ctx,JVar16,JVar18,2,(JSValue *)&local_58);
      unaff_RBX = (ulong)JVar18.u.ptr >> 0x20;
      bVar4 = false;
    }
    uVar14 = unaff_RBX;
    if (!bVar4) goto LAB_0016b353;
  }
  JVar17 = JS_ToStringInternal(ctx,this_val,0);
  JVar6 = JVar17.u;
  JVar16.tag = 3;
  JVar16.u.ptr = local_98.ptr;
  local_90 = JVar6;
  if ((uint)JVar17.tag == 6) {
    JVar18 = (JSValue)(ZEXT816(3) << 0x40);
    uVar14 = 0;
  }
  else {
    sh = ctx->array_shape;
    (sh->header).ref_count = (sh->header).ref_count + 1;
    JVar18 = JS_NewObjectFromShape(ctx,sh,2);
    JVar16.tag = 3;
    JVar16.u.ptr = local_98.ptr;
    uVar14 = (ulong)JVar18.u.ptr >> 0x20;
    if ((int)JVar18.tag != 6) {
      uVar7 = (uint)iVar9;
      if (uVar7 == 3) {
        local_9c = 0xffffffff;
      }
      else {
        if (0xfffffff4 < uVar7) {
          *piVar1 = *piVar1 + 1;
        }
        iVar5 = JS_ToInt32Free(ctx,(int32_t *)&local_9c,JVar15);
        JVar16.tag = 3;
        JVar16.u.ptr = local_98.ptr;
        if (iVar5 < 0) goto LAB_0016b298;
      }
      JVar8 = local_90;
      uVar2 = *(undefined8 *)((long)local_90.ptr + 4);
      JVar16 = JS_ToStringInternal(ctx,JVar19,0);
      iVar9 = JVar16.tag;
      local_98 = JVar16.u;
      if ((int)JVar16.tag != 6) {
        if ((ulong)local_9c == 0) {
LAB_0016b3a1:
          local_98 = JVar16.u;
          JVar17.u.float64 = local_90.float64;
          JS_FreeValue(ctx,JVar17);
          JVar19.tag = JVar16.tag;
          JVar19.u.float64 = local_98.float64;
          JS_FreeValue(ctx,JVar19);
          goto LAB_0016b353;
        }
        uVar7 = (uint)uVar2 & 0x7fffffff;
        if (uVar12 == 3) {
LAB_0016b10d:
          iVar5 = 0;
          local_c0 = 0;
        }
        else {
          uVar13 = (ulong)((uint)*(undefined8 *)((long)local_98.ptr + 4) & 0x7fffffff);
          local_60 = local_98;
          if ((ulong)uVar7 == 0) {
            if (uVar13 == 0) goto LAB_0016b3a1;
            goto LAB_0016b10d;
          }
          uVar10 = (ulong)(uVar13 == 0);
          local_68 = (uVar7 - uVar13) - uVar10;
          if (local_68 < (long)uVar10) {
            iVar5 = 0;
            local_c0 = 0;
          }
          else {
            local_70 = (ulong)local_9c - 1;
            local_c0 = 0;
            lVar11 = 0;
            local_80 = uVar10;
            local_78 = uVar13;
            do {
              iVar5 = string_indexof((JSString *)JVar8.ptr,(JSString *)local_60.ptr,(int)uVar10);
              if (iVar5 < 0) break;
              local_84 = iVar5;
              JVar19 = js_sub_string(ctx,(JSString *)JVar8.ptr,(int)lVar11,iVar5);
              if ((int)JVar19.tag == 6) goto LAB_0016b289;
              iVar5 = JS_CreateDataPropertyUint32(ctx,JVar18,local_c0,JVar19,0);
              JVar16.tag = iVar9;
              JVar16.u.ptr = local_98.ptr;
              if (iVar5 < 0) goto LAB_0016b298;
              if (local_70 == local_c0) goto LAB_0016b3a1;
              lVar11 = (long)local_84 + local_78;
              uVar10 = local_80 + lVar11;
              local_c0 = local_c0 + 1;
            } while ((long)uVar10 <= local_68);
            iVar5 = (int)lVar11;
            local_c0 = local_c0 & 0xffffffff;
          }
        }
        JVar19 = js_sub_string(ctx,(JSString *)JVar8.ptr,iVar5,uVar7);
        if ((int)JVar19.tag == 6) {
LAB_0016b289:
          JVar16.tag = iVar9;
          JVar16.u.ptr = local_98.ptr;
        }
        else {
          iVar5 = JS_CreateDataPropertyUint32(ctx,JVar18,local_c0,JVar19,0);
          JVar16.tag = iVar9;
          JVar16.u.ptr = local_98.ptr;
          if (-1 < iVar5) goto LAB_0016b3a1;
        }
      }
    }
  }
LAB_0016b298:
  local_98 = JVar16.u;
  JVar8.ptr = (void *)((ulong)JVar18.u.ptr & 0xffffffff | uVar14 << 0x20);
  if ((0xfffffff4 < (uint)JVar18.tag) &&
     (iVar5 = *JVar8.ptr, *(int *)JVar8.ptr = iVar5 + -1, iVar5 < 2)) {
    JVar18.tag = JVar18.tag;
    JVar18.u.ptr = JVar8.ptr;
    __JS_FreeValueRT(ctx->rt,JVar18);
  }
  if ((0xfffffff4 < (uint)JVar17.tag) &&
     (iVar5 = *JVar6.ptr, *(int *)JVar6.ptr = iVar5 + -1, iVar5 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar17);
  }
  if ((0xfffffff4 < (uint)JVar16.tag) &&
     (iVar5 = *local_98.ptr, *(int *)local_98.ptr = iVar5 + -1, iVar5 < 2)) {
    JVar15.tag = JVar16.tag;
    JVar15.u.ptr = local_98.ptr;
    __JS_FreeValueRT(ctx->rt,JVar15);
  }
  JVar18 = (JSValue)(ZEXT816(6) << 0x40);
  uVar14 = unaff_RBX;
LAB_0016b353:
  JVar20.u.ptr = (void *)((ulong)JVar18.u.ptr & 0xffffffff | uVar14 << 0x20);
  JVar20.tag = JVar18.tag;
  return JVar20;
}

Assistant:

static JSValue js_string_split(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv)
{
    // split(sep, limit)
    JSValueConst O = this_val, separator = argv[0], limit = argv[1];
    JSValueConst args[2];
    JSValue S, A, R, T;
    uint32_t lim, lengthA;
    int64_t p, q, s, r, e;
    JSString *sp, *rp;

    if (JS_IsUndefined(O) || JS_IsNull(O))
        return JS_ThrowTypeError(ctx, "cannot convert to object");

    S = JS_UNDEFINED;
    A = JS_UNDEFINED;
    R = JS_UNDEFINED;

    if (!JS_IsUndefined(separator) && !JS_IsNull(separator)) {
        JSValue splitter;
        splitter = JS_GetProperty(ctx, separator, JS_ATOM_Symbol_split);
        if (JS_IsException(splitter))
            return JS_EXCEPTION;
        if (!JS_IsUndefined(splitter) && !JS_IsNull(splitter)) {
            args[0] = O;
            args[1] = limit;
            return JS_CallFree(ctx, splitter, separator, 2, args);
        }
    }
    S = JS_ToString(ctx, O);
    if (JS_IsException(S))
        goto exception;
    A = JS_NewArray(ctx);
    if (JS_IsException(A))
        goto exception;
    lengthA = 0;
    if (JS_IsUndefined(limit)) {
        lim = 0xffffffff;
    } else {
        if (JS_ToUint32(ctx, &lim, limit) < 0)
            goto exception;
    }
    sp = JS_VALUE_GET_STRING(S);
    s = sp->len;
    R = JS_ToString(ctx, separator);
    if (JS_IsException(R))
        goto exception;
    rp = JS_VALUE_GET_STRING(R);
    r = rp->len;
    p = 0;
    if (lim == 0)
        goto done;
    if (JS_IsUndefined(separator))
        goto add_tail;
    if (s == 0) {
        if (r != 0)
            goto add_tail;
        goto done;
    }
    q = p;
    for (q = p; (q += !r) <= s - r - !r; q = p = e + r) {
        e = string_indexof(sp, rp, q);
        if (e < 0)
            break;
        T = js_sub_string(ctx, sp, p, e);
        if (JS_IsException(T))
            goto exception;
        if (JS_CreateDataPropertyUint32(ctx, A, lengthA++, T, 0) < 0)
            goto exception;
        if (lengthA == lim)
            goto done;
    }
add_tail:
    T = js_sub_string(ctx, sp, p, s);
    if (JS_IsException(T))
        goto exception;
    if (JS_CreateDataPropertyUint32(ctx, A, lengthA++, T,0 ) < 0)
        goto exception;
done:
    JS_FreeValue(ctx, S);
    JS_FreeValue(ctx, R);
    return A;

exception:
    JS_FreeValue(ctx, A);
    JS_FreeValue(ctx, S);
    JS_FreeValue(ctx, R);
    return JS_EXCEPTION;
}